

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

bool __thiscall jwt::payload::has_expires_at(payload *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  payload *local_10;
  payload *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"exp",&local_31);
  bVar1 = has_payload_claim(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return bVar1;
}

Assistant:

bool has_expires_at() const noexcept { return has_payload_claim("exp"); }